

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_fillreadbuffer(connectdata *conn,size_t bytes,size_t *nreadp)

{
  Curl_send_buffer **buffer;
  char **ppcVar1;
  int *piVar2;
  undefined1 *puVar3;
  trailers_state tVar4;
  Curl_easy *data_00;
  bool bVar5;
  int iVar6;
  CURLcode CVar7;
  Curl_send_buffer *pCVar8;
  size_t sVar9;
  code *pcVar10;
  size_t sVar11;
  char *pcVar12;
  char *__dest;
  Curl_easy *pCVar13;
  Curl_easy *data;
  size_t __n;
  curl_slist *trailers;
  undefined1 local_48 [7];
  uint uStack_41;
  ulong local_38;
  
  data_00 = conn->data;
  if ((data_00->state).trailers_state == TRAILERS_INITIALIZED) {
    local_48 = (undefined1  [7])0x0;
    uStack_41 = uStack_41 & 0xffffff00;
    Curl_infof(data_00,"Moving trailers state machine from initialized to sending.\n");
    (data_00->state).trailers_state = TRAILERS_SENDING;
    pCVar8 = Curl_add_buffer_init();
    (data_00->state).trailers_buf = pCVar8;
    if (pCVar8 == (Curl_send_buffer *)0x0) {
      bVar5 = false;
      Curl_failf(data_00,"Unable to allocate trailing headers buffer !");
      CVar7 = CURLE_OUT_OF_MEMORY;
    }
    else {
      buffer = &(data_00->state).trailers_buf;
      (data_00->state).trailers_bytes_sent = 0;
      Curl_set_in_callback(data_00,true);
      iVar6 = (*(data_00->set).trailer_callback)
                        ((curl_slist **)local_48,(data_00->set).trailer_data);
      Curl_set_in_callback(data_00,false);
      if (iVar6 == 0) {
        CVar7 = Curl_http_compile_trailers
                          ((curl_slist *)CONCAT17((undefined1)uStack_41,local_48),buffer,data_00);
      }
      else {
        Curl_failf(data_00,"operation aborted by trailing headers callback");
        *nreadp = 0;
        CVar7 = CURLE_ABORTED_BY_CALLBACK;
      }
      if (CVar7 == CURLE_OK) {
        Curl_infof(data_00,"Successfully compiled trailers.\r\n");
        curl_slist_free_all((curl_slist *)CONCAT17((undefined1)uStack_41,local_48));
        bVar5 = true;
      }
      else {
        Curl_add_buffer_free(buffer);
        curl_slist_free_all((curl_slist *)CONCAT17((undefined1)uStack_41,local_48));
        bVar5 = false;
      }
    }
    if (!bVar5) {
      return CVar7;
    }
  }
  if ((((data_00->req).field_0x570 & 0x40) != 0) &&
     ((data_00->state).trailers_state == TRAILERS_NONE)) {
    bytes = bytes - 0xc;
    ppcVar1 = &(data_00->req).upload_fromhere;
    *ppcVar1 = *ppcVar1 + 10;
  }
  if ((data_00->state).trailers_state == TRAILERS_SENDING) {
    pcVar10 = Curl_trailers_read;
    pCVar13 = data_00;
  }
  else {
    pcVar10 = (data_00->state).fread_func;
    pCVar13 = (Curl_easy *)(data_00->state).in;
  }
  Curl_set_in_callback(data_00,true);
  sVar9 = (*pcVar10)((data_00->req).upload_fromhere,1,bytes,pCVar13);
  Curl_set_in_callback(data_00,false);
  if (sVar9 == 0x10000001) {
    if ((conn->handler->flags & 0x10) == 0) {
      piVar2 = &(data_00->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 | 0x20;
      if (((data_00->req).field_0x570 & 0x40) != 0) {
        ppcVar1 = &(data_00->req).upload_fromhere;
        *ppcVar1 = *ppcVar1 + -10;
      }
      *nreadp = 0;
      return CURLE_OK;
    }
    pcVar12 = "Read callback asked for PAUSE when not supported!";
LAB_0012377d:
    Curl_failf(data_00,pcVar12);
    return CURLE_READ_ERROR;
  }
  if (sVar9 == 0x10000000) {
    Curl_failf(data_00,"operation aborted by callback");
    *nreadp = 0;
    return CURLE_ABORTED_BY_CALLBACK;
  }
  if (bytes < sVar9) {
    *nreadp = 0;
    pcVar12 = "read function returned funny value";
    goto LAB_0012377d;
  }
  sVar11 = sVar9;
  if ((*(ushort *)&(data_00->req).field_0x570 & 0x140) != 0x40) goto LAB_001238ed;
  local_38 = *(ulong *)&(data_00->set).field_0x8e8;
  pcVar12 = "\n";
  if ((local_38 & 0x840) == 0) {
    pcVar12 = "\r\n";
  }
  if ((data_00->state).trailers_state == TRAILERS_SENDING) {
    bVar5 = false;
    __n = 0;
  }
  else {
    local_48 = (undefined1  [7])0x0;
    uStack_41 = 0;
    iVar6 = curl_msnprintf(local_48,0xb,"%zx%s",sVar9,pcVar12);
    __n = (size_t)iVar6;
    __dest = (data_00->req).upload_fromhere + -__n;
    (data_00->req).upload_fromhere = __dest;
    sVar11 = __n + sVar9;
    memcpy(__dest,local_48,__n);
    if (((sVar9 == 0) && ((data_00->set).trailer_callback != (curl_trailer_callback)0x0)) &&
       ((data_00->state).trailers_state == TRAILERS_NONE)) {
      (data_00->state).trailers_state = TRAILERS_INITIALIZED;
      bVar5 = false;
    }
    else {
      memcpy((data_00->req).upload_fromhere + sVar11,pcVar12,(ulong)((local_38 & 0x840) == 0) + 1);
      bVar5 = true;
    }
  }
  tVar4 = (data_00->state).trailers_state;
  if ((tVar4 == TRAILERS_SENDING) &&
     (((data_00->state).trailers_buf)->size_used == (data_00->state).trailers_bytes_sent)) {
    Curl_add_buffer_free(&(data_00->state).trailers_buf);
    (data_00->state).trailers_state = TRAILERS_DONE;
    (data_00->set).trailer_data = (void *)0x0;
    (data_00->set).trailer_callback = (curl_trailer_callback)0x0;
    pcVar12 = "Signaling end of chunked upload after trailers.\n";
LAB_001238c1:
    puVar3 = &(data_00->req).field_0x570;
    *puVar3 = *puVar3 | 4;
    Curl_infof(data_00,pcVar12);
  }
  else if (tVar4 != TRAILERS_INITIALIZED && sVar11 == __n) {
    pcVar12 = "Signaling end of chunked upload via terminating chunk.\n";
    goto LAB_001238c1;
  }
  if (bVar5) {
    sVar11 = sVar11 + 1 + (ulong)((local_38 & 0x840) == 0);
  }
LAB_001238ed:
  *nreadp = sVar11;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_fillreadbuffer(struct connectdata *conn, size_t bytes,
                             size_t *nreadp)
{
  struct Curl_easy *data = conn->data;
  size_t buffersize = bytes;
  size_t nread;

  curl_read_callback readfunc = NULL;
  void *extra_data = NULL;

#ifdef CURL_DOES_CONVERSIONS
  bool sending_http_headers = FALSE;

  if(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)) {
    const struct HTTP *http = data->req.protop;

    if(http->sending == HTTPSEND_REQUEST)
      /* We're sending the HTTP request headers, not the data.
         Remember that so we don't re-translate them into garbage. */
      sending_http_headers = TRUE;
  }
#endif

#ifndef CURL_DISABLE_HTTP
  if(data->state.trailers_state == TRAILERS_INITIALIZED) {
    struct curl_slist *trailers = NULL;
    CURLcode result;
    int trailers_ret_code;

    /* at this point we already verified that the callback exists
       so we compile and store the trailers buffer, then proceed */
    infof(data,
          "Moving trailers state machine from initialized to sending.\n");
    data->state.trailers_state = TRAILERS_SENDING;
    data->state.trailers_buf = Curl_add_buffer_init();
    if(!data->state.trailers_buf) {
      failf(data, "Unable to allocate trailing headers buffer !");
      return CURLE_OUT_OF_MEMORY;
    }
    data->state.trailers_bytes_sent = 0;
    Curl_set_in_callback(data, true);
    trailers_ret_code = data->set.trailer_callback(&trailers,
                                                   data->set.trailer_data);
    Curl_set_in_callback(data, false);
    if(trailers_ret_code == CURL_TRAILERFUNC_OK) {
      result = Curl_http_compile_trailers(trailers, &data->state.trailers_buf,
                                          data);
    }
    else {
      failf(data, "operation aborted by trailing headers callback");
      *nreadp = 0;
      result = CURLE_ABORTED_BY_CALLBACK;
    }
    if(result) {
      Curl_add_buffer_free(&data->state.trailers_buf);
      curl_slist_free_all(trailers);
      return result;
    }
    infof(data, "Successfully compiled trailers.\r\n");
    curl_slist_free_all(trailers);
  }
#endif

  /* if we are transmitting trailing data, we don't need to write
     a chunk size so we skip this */
  if(data->req.upload_chunky &&
     data->state.trailers_state == TRAILERS_NONE) {
    /* if chunked Transfer-Encoding */
    buffersize -= (8 + 2 + 2);   /* 32bit hex + CRLF + CRLF */
    data->req.upload_fromhere += (8 + 2); /* 32bit hex + CRLF */
  }

#ifndef CURL_DISABLE_HTTP
  if(data->state.trailers_state == TRAILERS_SENDING) {
    /* if we're here then that means that we already sent the last empty chunk
       but we didn't send a final CR LF, so we sent 0 CR LF. We then start
       pulling trailing data until we have no more at which point we
       simply return to the previous point in the state machine as if
       nothing happened.
       */
    readfunc = Curl_trailers_read;
    extra_data = (void *)data;
  }
  else
#endif
  {
    readfunc = data->state.fread_func;
    extra_data = data->state.in;
  }

  Curl_set_in_callback(data, true);
  nread = readfunc(data->req.upload_fromhere, 1,
                   buffersize, extra_data);
  Curl_set_in_callback(data, false);

  if(nread == CURL_READFUNC_ABORT) {
    failf(data, "operation aborted by callback");
    *nreadp = 0;
    return CURLE_ABORTED_BY_CALLBACK;
  }
  if(nread == CURL_READFUNC_PAUSE) {
    struct SingleRequest *k = &data->req;

    if(conn->handler->flags & PROTOPT_NONETWORK) {
      /* protocols that work without network cannot be paused. This is
         actually only FILE:// just now, and it can't pause since the transfer
         isn't done using the "normal" procedure. */
      failf(data, "Read callback asked for PAUSE when not supported!");
      return CURLE_READ_ERROR;
    }

    /* CURL_READFUNC_PAUSE pauses read callbacks that feed socket writes */
    k->keepon |= KEEP_SEND_PAUSE; /* mark socket send as paused */
    if(data->req.upload_chunky) {
        /* Back out the preallocation done above */
      data->req.upload_fromhere -= (8 + 2);
    }
    *nreadp = 0;

    return CURLE_OK; /* nothing was read */
  }
  else if(nread > buffersize) {
    /* the read function returned a too large value */
    *nreadp = 0;
    failf(data, "read function returned funny value");
    return CURLE_READ_ERROR;
  }

  if(!data->req.forbidchunk && data->req.upload_chunky) {
    /* if chunked Transfer-Encoding
     *    build chunk:
     *
     *        <HEX SIZE> CRLF
     *        <DATA> CRLF
     */
    /* On non-ASCII platforms the <DATA> may or may not be
       translated based on set.prefer_ascii while the protocol
       portion must always be translated to the network encoding.
       To further complicate matters, line end conversion might be
       done later on, so we need to prevent CRLFs from becoming
       CRCRLFs if that's the case.  To do this we use bare LFs
       here, knowing they'll become CRLFs later on.
     */

    bool added_crlf = FALSE;
    int hexlen = 0;
    const char *endofline_native;
    const char *endofline_network;

    if(
#ifdef CURL_DO_LINEEND_CONV
       (data->set.prefer_ascii) ||
#endif
       (data->set.crlf)) {
      /* \n will become \r\n later on */
      endofline_native  = "\n";
      endofline_network = "\x0a";
    }
    else {
      endofline_native  = "\r\n";
      endofline_network = "\x0d\x0a";
    }

    /* if we're not handling trailing data, proceed as usual */
    if(data->state.trailers_state != TRAILERS_SENDING) {
      char hexbuffer[11] = "";
      hexlen = msnprintf(hexbuffer, sizeof(hexbuffer),
                         "%zx%s", nread, endofline_native);

      /* move buffer pointer */
      data->req.upload_fromhere -= hexlen;
      nread += hexlen;

      /* copy the prefix to the buffer, leaving out the NUL */
      memcpy(data->req.upload_fromhere, hexbuffer, hexlen);

      /* always append ASCII CRLF to the data unless
         we have a valid trailer callback */
#ifndef CURL_DISABLE_HTTP
      if((nread-hexlen) == 0 &&
          data->set.trailer_callback != NULL &&
          data->state.trailers_state == TRAILERS_NONE) {
        data->state.trailers_state = TRAILERS_INITIALIZED;
      }
      else
#endif
      {
        memcpy(data->req.upload_fromhere + nread,
               endofline_network,
               strlen(endofline_network));
        added_crlf = TRUE;
      }
    }

#ifdef CURL_DOES_CONVERSIONS
    {
      CURLcode result;
      size_t length;
      if(data->set.prefer_ascii)
        /* translate the protocol and data */
        length = nread;
      else
        /* just translate the protocol portion */
        length = hexlen;
      if(length) {
        result = Curl_convert_to_network(data, data->req.upload_fromhere,
                                         length);
        /* Curl_convert_to_network calls failf if unsuccessful */
        if(result)
          return result;
      }
    }
#endif /* CURL_DOES_CONVERSIONS */

#ifndef CURL_DISABLE_HTTP
    if(data->state.trailers_state == TRAILERS_SENDING &&
       !Curl_trailers_left(data)) {
      Curl_add_buffer_free(&data->state.trailers_buf);
      data->state.trailers_state = TRAILERS_DONE;
      data->set.trailer_data = NULL;
      data->set.trailer_callback = NULL;
      /* mark the transfer as done */
      data->req.upload_done = TRUE;
      infof(data, "Signaling end of chunked upload after trailers.\n");
    }
    else
#endif
      if((nread - hexlen) == 0 &&
         data->state.trailers_state != TRAILERS_INITIALIZED) {
        /* mark this as done once this chunk is transferred */
        data->req.upload_done = TRUE;
        infof(data,
              "Signaling end of chunked upload via terminating chunk.\n");
      }

    if(added_crlf)
      nread += strlen(endofline_network); /* for the added end of line */
  }
#ifdef CURL_DOES_CONVERSIONS
  else if((data->set.prefer_ascii) && (!sending_http_headers)) {
    CURLcode result;
    result = Curl_convert_to_network(data, data->req.upload_fromhere, nread);
    /* Curl_convert_to_network calls failf if unsuccessful */
    if(result)
      return result;
  }
#endif /* CURL_DOES_CONVERSIONS */

  *nreadp = nread;

  return CURLE_OK;
}